

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

char * gl4cts::anon_unknown_0::GetInputOp2
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data,
                 vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  pointer puVar1;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0x80);
  puVar1 = (in_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = 0x80;
  puVar1[3] = '?';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1[0x10] = '\0';
  puVar1[0x11] = '\0';
  puVar1[0x12] = '\0';
  puVar1[0x13] = '\0';
  puVar1[0x14] = '\0';
  puVar1[0x15] = '\0';
  puVar1[0x16] = 0x80;
  puVar1[0x17] = '?';
  puVar1[0x18] = '\0';
  puVar1[0x19] = '\0';
  puVar1[0x1a] = '\0';
  puVar1[0x1b] = '\0';
  puVar1[0x1c] = '\0';
  puVar1[0x1d] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  puVar1[0x20] = '\0';
  puVar1[0x21] = '\0';
  puVar1[0x22] = '\0';
  puVar1[0x23] = '\0';
  puVar1[0x24] = '\0';
  puVar1[0x25] = '\0';
  puVar1[0x26] = '\0';
  puVar1[0x27] = '\0';
  puVar1[0x28] = '\0';
  puVar1[0x29] = '\0';
  puVar1[0x2a] = 0x80;
  puVar1[0x2b] = '?';
  puVar1[0x2c] = '\0';
  puVar1[0x2d] = '\0';
  puVar1[0x2e] = '\0';
  puVar1[0x2f] = '\0';
  puVar1[0x30] = '\0';
  puVar1[0x31] = '\0';
  puVar1[0x32] = '\0';
  puVar1[0x33] = '\0';
  puVar1[0x34] = '\0';
  puVar1[0x35] = '\0';
  puVar1[0x36] = '\0';
  puVar1[0x37] = '\0';
  puVar1[0x38] = '\0';
  puVar1[0x39] = '\0';
  puVar1[0x3a] = '\0';
  puVar1[0x3b] = '\0';
  puVar1[0x3c] = '\0';
  puVar1[0x3d] = '\0';
  puVar1[0x3e] = 0x80;
  puVar1[0x3f] = '?';
  puVar1[0x40] = '\0';
  puVar1[0x41] = '\0';
  puVar1[0x42] = '\0';
  puVar1[0x43] = '@';
  puVar1[0x44] = '\0';
  puVar1[0x45] = '\0';
  puVar1[0x46] = '\0';
  puVar1[0x47] = '\0';
  puVar1[0x48] = '\0';
  puVar1[0x49] = '\0';
  puVar1[0x4a] = '\0';
  puVar1[0x4b] = '\0';
  puVar1[0x4c] = '\0';
  puVar1[0x4d] = '\0';
  puVar1[0x4e] = '\0';
  puVar1[0x4f] = '\0';
  puVar1[0x50] = '\0';
  puVar1[0x51] = '\0';
  puVar1[0x52] = '\0';
  puVar1[0x53] = '\0';
  puVar1[0x54] = '\0';
  puVar1[0x55] = '\0';
  puVar1[0x56] = '@';
  puVar1[0x57] = '@';
  puVar1[0x58] = '\0';
  puVar1[0x59] = '\0';
  puVar1[0x5a] = '\0';
  puVar1[0x5b] = '\0';
  puVar1[0x5c] = '\0';
  puVar1[0x5d] = '\0';
  puVar1[0x5e] = '\0';
  puVar1[0x5f] = '\0';
  puVar1[0x60] = '\0';
  puVar1[0x61] = '\0';
  puVar1[0x62] = '\0';
  puVar1[99] = '\0';
  puVar1[100] = '\0';
  puVar1[0x65] = '\0';
  puVar1[0x66] = '\0';
  puVar1[0x67] = '\0';
  puVar1[0x68] = '\0';
  puVar1[0x69] = '\0';
  puVar1[0x6a] = 0x80;
  puVar1[0x6b] = '@';
  puVar1[0x6c] = '\0';
  puVar1[0x6d] = '\0';
  puVar1[0x6e] = '\0';
  puVar1[0x6f] = '\0';
  puVar1[0x70] = '\0';
  puVar1[0x71] = '\0';
  puVar1[0x72] = '\0';
  puVar1[0x73] = '\0';
  puVar1[0x74] = '\0';
  puVar1[0x75] = '\0';
  puVar1[0x76] = '\0';
  puVar1[0x77] = '\0';
  puVar1[0x78] = '\0';
  puVar1[0x79] = '\0';
  puVar1[0x7a] = '\0';
  puVar1[0x7b] = '\0';
  puVar1[0x7c] = '\0';
  puVar1[0x7d] = '\0';
  puVar1[0x7e] = 0xa0;
  puVar1[0x7f] = '@';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out_data,0x50);
  puVar1 = (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '@';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1[0x10] = '\0';
  puVar1[0x11] = '\0';
  puVar1[0x12] = '\0';
  puVar1[0x13] = '\0';
  puVar1[0x14] = '\0';
  puVar1[0x15] = '\0';
  puVar1[0x16] = '@';
  puVar1[0x17] = '@';
  puVar1[0x18] = '\0';
  puVar1[0x19] = '\0';
  puVar1[0x1a] = '\0';
  puVar1[0x1b] = '\0';
  puVar1[0x1c] = '\0';
  puVar1[0x1d] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  puVar1[0x20] = '\0';
  puVar1[0x21] = '\0';
  puVar1[0x22] = '\0';
  puVar1[0x23] = '\0';
  puVar1[0x24] = '\0';
  puVar1[0x25] = '\0';
  puVar1[0x26] = '\0';
  puVar1[0x27] = '\0';
  puVar1[0x28] = '\0';
  puVar1[0x29] = '\0';
  puVar1[0x2a] = 0x80;
  puVar1[0x2b] = '@';
  puVar1[0x2c] = '\0';
  puVar1[0x2d] = '\0';
  puVar1[0x2e] = '\0';
  puVar1[0x2f] = '\0';
  puVar1[0x30] = '\0';
  puVar1[0x31] = '\0';
  puVar1[0x32] = '\0';
  puVar1[0x33] = '\0';
  puVar1[0x34] = '\0';
  puVar1[0x35] = '\0';
  puVar1[0x36] = '\0';
  puVar1[0x37] = '\0';
  puVar1[0x38] = '\0';
  puVar1[0x39] = '\0';
  puVar1[0x3a] = '\0';
  puVar1[0x3b] = '\0';
  puVar1[0x3c] = '\0';
  puVar1[0x3d] = '\0';
  puVar1[0x3e] = 0xa0;
  puVar1[0x3f] = '@';
  puVar1[0x40] = '\0';
  puVar1[0x41] = '\0';
  puVar1[0x42] = '\0';
  puVar1[0x43] = '\0';
  puVar1[0x44] = '\0';
  puVar1[0x45] = '\0';
  puVar1[0x46] = 0x80;
  puVar1[0x47] = '?';
  puVar1[0x48] = '\0';
  puVar1[0x49] = '\0';
  puVar1[0x4a] = 0x80;
  puVar1[0x4b] = '@';
  puVar1[0x4c] = '\0';
  puVar1[0x4d] = '\0';
  puVar1[0x4e] = '\0';
  puVar1[0x4f] = '\0';
  return (char *)puVar1;
}

Assistant:

const char* GetInputOp2(std::vector<GLubyte>& in_data, std::vector<GLubyte>& out_data)
{
	/* input */
	{
		in_data.resize(16 * 8);
		float* fp = reinterpret_cast<float*>(&in_data[0]);
		fp[0]	 = 1.0f;
		fp[1]	 = 0.0f;
		fp[2]	 = 0.0f;
		fp[3]	 = 0.0f;
		fp[4]	 = 0.0f;
		fp[5]	 = 1.0f;
		fp[6]	 = 0.0f;
		fp[7]	 = 0.0f;
		fp[8]	 = 0.0f;
		fp[9]	 = 0.0f;
		fp[10]	= 1.0f;
		fp[11]	= 0.0f;
		fp[12]	= 0.0f;
		fp[13]	= 0.0f;
		fp[14]	= 0.0f;
		fp[15]	= 1.0f;

		fp[16] = 2.0f;
		fp[17] = 0.0f;
		fp[18] = 0.0f;
		fp[19] = 0.0f;
		fp[20] = 0.0f;
		fp[21] = 3.0f;
		fp[22] = 0.0f;
		fp[23] = 0.0f;
		fp[24] = 0.0f;
		fp[25] = 0.0f;
		fp[26] = 4.0f;
		fp[27] = 0.0f;
		fp[28] = 0.0f;
		fp[29] = 0.0f;
		fp[30] = 0.0f;
		fp[31] = 5.0f;
	}
	/* expected output */
	{
		out_data.resize(16 * 5);
		float* fp = reinterpret_cast<float*>(&out_data[0]);
		fp[0]	 = 2.0f;
		fp[1]	 = 0.0f;
		fp[2]	 = 0.0f;
		fp[3]	 = 0.0f;
		fp[4]	 = 0.0f;
		fp[5]	 = 3.0f;
		fp[6]	 = 0.0f;
		fp[7]	 = 0.0f;
		fp[8]	 = 0.0f;
		fp[9]	 = 0.0f;
		fp[10]	= 4.0f;
		fp[11]	= 0.0f;
		fp[12]	= 0.0f;
		fp[13]	= 0.0f;
		fp[14]	= 0.0f;
		fp[15]	= 5.0f;

		fp[16] = 0.0f;
		fp[17] = 1.0f;
		fp[18] = 4.0f;
		fp[19] = 0.0f;
	}
	return NL "layout(std430, binding = 0) buffer Input {" NL "  mat4 data0;" NL "  mat4 data1;" NL "} g_input;" NL
			  "layout(std430, binding = 1) buffer Output {" NL "  mat4 data0;" NL "  vec4 data1;" NL "} g_output;" NL
			  "uniform int g_index2 = 2;" NL "void main() {" NL
			  "  g_output.data0 = matrixCompMult(g_input.data0, g_input.data1);" NL
			  "  g_output.data1 = g_input.data0[1] + g_input.data1[g_index2];" NL "}";
}